

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpool.h
# Opt level: O2

void strpool_term(strpool_t *pool)

{
  undefined8 *puVar1;
  long lVar2;
  int i;
  long lVar3;
  
  lVar2 = 8;
  lVar3 = 0;
  while( true ) {
    puVar1 = (undefined8 *)pool->memctx;
    if (pool->block_count <= lVar3) break;
    (*(code *)*puVar1)(*(undefined8 *)((long)&pool->blocks->capacity + lVar2),0,0,0,0,0,puVar1[1]);
    lVar3 = lVar3 + 1;
    lVar2 = lVar2 + 0x20;
  }
  (*(code *)*puVar1)(pool->blocks,0,0,0,0,0,puVar1[1]);
  (**pool->memctx)(pool->handles,0,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8));
  (**pool->memctx)(pool->entries,0,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8));
  (**pool->memctx)(pool->hash_table,0,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8));
  return;
}

Assistant:

void strpool_term( strpool_t* pool )
    {
#if 0
    // Debug statistics
    printf( "\n\n" );
    printf( "Handles: %d/%d\n", pool->handle_count, pool->handle_capacity );
    printf( "Entries: %d/%d\n", pool->entry_count, pool->entry_capacity );
    printf( "Hashtable: %d/%d\n", pool->entry_count, pool->hash_capacity );
    printf( "Blocks: %d/%d\n", pool->block_count, pool->block_capacity );
    for( int i = 0; i < pool->block_count; ++i )
        {
        printf( "\n" );
        printf( "BLOCK: %d\n", i );
        printf( "Capacity: %d\n", pool->blocks[ i ].capacity );
        printf( "Free: [ %d ]", pool->blocks[ i ].capacity - ( pool->blocks[ i ].tail - pool->blocks[ i ].data ) );
        int fl = pool->blocks[ i ].free_list;
        int count = 0;
        int size = 0;
        int total = 0;
        while( fl >= 0 )
            {
            strpool_free_block_t* free_entry = (strpool_free_block_t*) ( pool->blocks[ i ].data + fl );
            total += free_entry->size;
            if( size == 0 ) { size = free_entry->size; }
            if( size != free_entry->size )
                {
                printf( ", %dx%d", count, size );
                count = 1;
                size = free_entry->size;
                }
            else
                {
                ++count;
                }
            fl = free_entry->next;
            }
        if( size != 0 ) printf( ", %dx%d", count, size );
        printf( ", { %d }\n", total );
        }
    printf( "\n\n" );
#endif

    for( int i = 0; i < pool->block_count; ++i ) STRPOOL_FREE( pool->memctx, pool->blocks[ i ].data );
    STRPOOL_FREE( pool->memctx, pool->blocks );         
    STRPOOL_FREE( pool->memctx, pool->handles );            
    STRPOOL_FREE( pool->memctx, pool->entries );            
    STRPOOL_FREE( pool->memctx, pool->hash_table );         
    }